

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w)

{
  int32_t iVar1;
  undefined8 in_RSI;
  uint32_t h;
  string *in_RDI;
  Dictionary *unaff_retaddr;
  
  h = (uint32_t)((ulong)in_RSI >> 0x20);
  hash(unaff_retaddr,in_RDI);
  iVar1 = find(unaff_retaddr,in_RDI,h);
  return iVar1;
}

Assistant:

int32_t Dictionary::find(const std::string& w) const {
	return find(w, hash(w));
}